

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

string * __thiscall
tinyusdz::value::GetTypeName_abi_cxx11_(string *__return_storage_ptr__,value *this,uint32_t tyid)

{
  value_type *pvVar1;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> ret;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  string local_40;
  
  TryGetTypeName_abi_cxx11_(&local_68,this,tyid);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_90,&local_68);
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_68);
  if (local_90.has_value_ == false) {
    std::__cxx11::to_string(&local_40,(uint)this);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   "(GetTypeName) [[Unknown or unimplemented/unsupported type_id: ",&local_40);
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_68,
                   "]]");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  else {
    pvVar1 = nonstd::optional_lite::
             optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&local_90);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar1);
  }
  nonstd::optional_lite::
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~optional(&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeName(uint32_t tyid) {
  auto ret = TryGetTypeName(tyid);

  if (!ret) {
    return "(GetTypeName) [[Unknown or unimplemented/unsupported type_id: " +
           std::to_string(tyid) + "]]";
  }

  return ret.value();
}